

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GeometryExpanderRenderTestInstance *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pVVar3;
  pointer pVVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  void *pvVar6;
  Context *context;
  pointer pcVar7;
  undefined8 uVar8;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Allocation *pAVar9;
  undefined8 renderPass;
  bool bVar10;
  deUint32 queueFamilyIndex;
  VkBool32 VVar11;
  int iVar12;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  const_iterator cVar13;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  size_t sVar14;
  GraphicsPipelineBuilder *pGVar15;
  TextureFormat format;
  long lVar16;
  int iVar17;
  char *__s;
  VkDeviceSize bufferSize;
  TestStatus *pTVar18;
  long lVar19;
  VkDeviceSize aVVar20 [1];
  VkDeviceSize bufferSize_00;
  VkVertexInputAttributeDescription vertexAttribute;
  VkExtent3D extent;
  VkImageSubresourceLayers subresourceLayers;
  IVec2 resolution;
  VkDeviceSize offsets [1];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  VkStructureType local_368 [2];
  undefined4 uStack_360;
  undefined4 uStack_35c;
  VkAccessFlags local_358;
  VkAccessFlags VStack_354;
  VkImageLayout VStack_350;
  VkImageLayout VStack_34c;
  Allocator *local_348;
  TestStatus *local_340;
  undefined1 local_338 [32];
  Allocation *local_318;
  Buffer local_308;
  string geometryShaderName;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_2b0;
  VkQueue local_298;
  long local_290;
  string local_288;
  Image local_268;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  VkPipeline local_1d8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_1d0;
  VkCommandPool local_1b8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_1b0;
  VkFramebuffer local_198;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_190;
  VkImageView local_178;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_170;
  VkPipelineLayout local_158;
  Deleter<vk::Handle<(vk::HandleType)16>_> local_150;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  
  local_340 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_298 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  resolution.m_data[0] = 0x100;
  resolution.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&resolution,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  local_348 = allocator;
  Image::Image(&local_268,vk,device,allocator,(VkImageCreateInfo *)&colorAttachmentLayoutBarrier,
               (MemoryRequirement)0x0);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  renderPass = colorAttachmentLayoutBarrier._0_8_;
  DStack_2b0.m_device._0_4_ = colorAttachmentLayoutBarrier.srcAccessMask;
  DStack_2b0.m_device._4_4_ = colorAttachmentLayoutBarrier.dstAccessMask;
  DStack_2b0.m_allocator._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  DStack_2b0.m_allocator._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  DStack_2b0.m_deviceIface._0_4_ = colorAttachmentLayoutBarrier.pNext._0_4_;
  DStack_2b0.m_deviceIface._4_4_ = colorAttachmentLayoutBarrier.pNext._4_4_;
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&local_158,this,vk,device);
  local_1f8 = 1;
  uStack_1f0 = 1;
  local_1e8 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_178.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_170.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)renderPass,(VkImageView)colorAttachmentLayoutBarrier._0_8_,
                  resolution.m_data[0],resolution.m_data[1],1);
  local_198.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_190.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_1b8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_1b0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_358 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_354 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_350 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_34c = colorAttachmentLayoutBarrier.newLayout;
  local_368[0] = colorAttachmentLayoutBarrier.sType;
  local_368[1] = colorAttachmentLayoutBarrier._4_4_;
  uStack_360 = colorAttachmentLayoutBarrier.pNext._0_4_;
  uStack_35c = colorAttachmentLayoutBarrier.pNext._4_4_;
  pVVar3 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_290 = (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  __s = "geometry_pointsize";
  colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&colorAttachmentLayoutBarrier,"geometry_pointsize","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&colorAttachmentLayoutBarrier);
  if ((_Rb_tree_header *)cVar13._M_node == &(p_Var5->_M_impl).super__Rb_tree_header) {
    __s = "geometry";
  }
  else {
    vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
    physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar11 = checkPointSize(vki,physDevice);
    if (VVar11 == 0) {
      __s = "geometry";
    }
  }
  geometryShaderName._M_dataplus._M_p = (pointer)&geometryShaderName.field_2;
  sVar14 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&geometryShaderName,__s,__s + sVar14);
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    CONCAT44(colorAttachmentLayoutBarrier.dstAccessMask,
                             colorAttachmentLayoutBarrier.srcAccessMask) + 1);
  }
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  colorAttachmentLayoutBarrier.sType = resolution.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = resolution.m_data[1];
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"vertex","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_338);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar13._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,&geometryShaderName);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                       *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  offsets[0] = (VkDeviceSize)&local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)offsets,"fragment","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)offsets);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
  pGVar15 = GraphicsPipelineBuilder::addVertexBinding
                      (pGVar15,(VkVertexInputBindingDescription)ZEXT812(0x2000000000));
  pGVar15 = GraphicsPipelineBuilder::addVertexAttribute
                      (pGVar15,(VkVertexInputAttributeDescription)(ZEXT816(0x6d) << 0x40));
  vertexAttribute.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttribute.offset = 0x10;
  vertexAttribute.location = 1;
  vertexAttribute.binding = 0;
  pGVar15 = GraphicsPipelineBuilder::addVertexAttribute(pGVar15,vertexAttribute);
  pGVar15->m_primitiveTopology = this->m_primitiveType;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_308,pGVar15,vk,device,local_158,
             (VkRenderPass)renderPass);
  DStack_1d0.m_device =
       local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_1d0.m_allocator =
       local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_1d8.m_internal =
       local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_1d0.m_deviceIface =
       local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
  ;
  local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsets[0] != &local_378) {
    operator_delete((void *)offsets[0],local_378._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  iVar17 = resolution.m_data[1] * resolution.m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar12 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar17 * iVar12);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,2);
  geometry::Buffer::Buffer
            (&local_308,vk,device,local_348,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  bufferSize_00 = (long)pVVar3 + (local_290 - (long)pVVar4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_00,0x80);
  geometry::Buffer::Buffer
            ((Buffer *)local_338,vk,device,local_348,
             (VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,(MemoryRequirement)0x1);
  if (0 < this->m_numDrawVertices) {
    pvVar6 = local_318->m_hostPtr;
    lVar16 = 0;
    lVar19 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_vertexPosData).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar6 + lVar16 * 2);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)
               ((long)((this->m_vertexAttrData).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar6 + lVar16 * 2 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      lVar19 = lVar19 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar19 < this->m_numDrawVertices);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(local_318->m_memory).m_internal,local_318->m_offset,
             bufferSize_00);
  beginCommandBuffer(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  local_218 = 1;
  uStack_210 = 1;
  local_208 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),1,0x80,0,0,0,0,0,1,
             (int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)resolution.m_data;
  offsets[0] = 0;
  beginRenderPass(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]),(VkRenderPass)renderPass,
                  local_198,(VkRect2D *)&colorAttachmentLayoutBarrier,(Vec4 *)offsets);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,CONCAT44(local_368[1],local_368[0]),0,local_1d8.m_internal);
  colorAttachmentLayoutBarrier._0_8_ = local_338._0_8_;
  offsets[0] = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,CONCAT44(local_368[1],local_368[0]),0,1);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this,vk,device,local_348,local_368,&local_158)
  ;
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,local_368);
  endRenderPass(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  local_238 = 1;
  uStack_230 = 1;
  local_228 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),0x400,0x1000,0,0,0,0,0,1,
             (int)&colorAttachmentLayoutBarrier);
  extent.depth = 1;
  extent.width = resolution.m_data[0];
  extent.height = resolution.m_data[1];
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,CONCAT44(local_368[1],local_368[0]),
             local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),0x1000,0x4000,0,0,0,1,
             &colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  submitCommandsAndWait(vk,device,local_298,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  pAVar9 = local_308.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_308.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_308.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  offsets[0] = (VkDeviceSize)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,(TextureFormat *)offsets,
             resolution.m_data[0],resolution.m_data[1],1,pAVar9->m_hostPtr);
  context = (this->super_TestInstance).m_context;
  pcVar7 = (this->m_name)._M_dataplus._M_p;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar7,pcVar7 + (this->m_name)._M_string_length);
  bVar10 = compareWithFileImage
                     (context,(ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&colorAttachmentLayoutBarrier,"Pass","");
    pTVar18 = local_340;
    local_340->m_code = QP_TEST_RESULT_PASS;
    (local_340->m_description)._M_dataplus._M_p = (pointer)&(local_340->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
    if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ ==
        &colorAttachmentLayoutBarrier.srcAccessMask) goto LAB_009eb10d;
    local_378._M_allocated_capacity =
         CONCAT44(colorAttachmentLayoutBarrier.dstAccessMask,
                  colorAttachmentLayoutBarrier.srcAccessMask);
    aVVar20[0] = colorAttachmentLayoutBarrier._0_8_;
  }
  else {
    offsets[0] = (VkDeviceSize)&local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)offsets,"Fail","");
    pTVar18 = local_340;
    local_340->m_code = QP_TEST_RESULT_FAIL;
    (local_340->m_description)._M_dataplus._M_p = (pointer)&(local_340->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340->m_description,offsets[0],offsets[0] + 0x3f80000000000000);
    aVVar20[0] = offsets[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)offsets[0] == &local_378) goto LAB_009eb10d;
  }
  operator_delete((void *)aVVar20[0],local_378._M_allocated_capacity + 1);
LAB_009eb10d:
  if (local_318 != (Allocation *)0x0) {
    (*local_318->_vptr_Allocation[1])();
    local_318 = (Allocation *)0x0;
  }
  if ((pointer)local_338._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_338 + 8),(VkBuffer)local_338._0_8_)
    ;
  }
  if (local_308.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_308.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_308.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_308.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_1d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_1d0,local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geometryShaderName._M_dataplus._M_p != &geometryShaderName.field_2) {
    operator_delete(geometryShaderName._M_dataplus._M_p,
                    geometryShaderName.field_2._M_allocated_capacity + 1);
  }
  if (CONCAT44(local_368[1],local_368[0]) != 0) {
    colorAttachmentLayoutBarrier._0_8_ = CONCAT44(local_368[1],local_368[0]);
    (**(code **)(*(long *)CONCAT44(uStack_35c,uStack_360) + 0x240))
              ((long *)CONCAT44(uStack_35c,uStack_360),CONCAT44(VStack_354,local_358),
               CONCAT44(VStack_34c,VStack_350),1);
  }
  if (local_1b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_1b0,local_1b8);
  }
  if (local_198.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_190,local_198);
  }
  if (local_178.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_170,local_178);
  }
  if (local_158.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&local_150,local_158);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_2b0,(VkRenderPass)renderPass);
  }
  if (local_268.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_268.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_268.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_268.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  return pTVar18;
}

Assistant:

tcu::TestStatus GeometryExpanderRenderTestInstance::iterate (void)
{
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkDevice					device					= m_context.getDevice();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= m_context.getUniversalQueue();
	Allocator&						memAlloc				= m_context.getDefaultAllocator();
	const IVec2						resolution				= IVec2(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const Image						colorAttachmentImage	(
																vk,
																device,
																memAlloc,
																makeImageCreateInfo(resolution, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_BUFFER_USAGE_TRANSFER_SRC_BIT),
																MemoryRequirement::Any
															);
	const Unique<VkRenderPass>		renderPass				(makeRenderPass(vk, device, colorFormat));

	const Move<VkPipelineLayout>	pipelineLayout			(createPipelineLayout(vk, device));
	const VkImageSubresourceRange	colorSubRange			= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView>		colorAttachmentView		(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorSubRange));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, resolution.x(), resolution.y(), 1u));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkDeviceSize				vertexDataSizeBytes		= sizeInBytes(m_vertexPosData) + sizeInBytes(m_vertexAttrData);
	const deUint32					vertexPositionsOffset	= 0u;
	const deUint32					vertexAtrrOffset		= static_cast<deUint32>(sizeof(Vec4));
	const string					geometryShaderName		= (m_context.getBinaryCollection().contains("geometry_pointsize") && checkPointSize (m_context.getInstanceInterface(), m_context.getPhysicalDevice()))?
																"geometry_pointsize" : "geometry";

	const Unique<VkPipeline>		pipeline				(GraphicsPipelineBuilder()
																.setRenderSize			(resolution)
																.setShader				(vk, device, VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vertex"), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get(geometryShaderName), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("fragment"), DE_NULL)
																.addVertexBinding		(makeVertexInputBindingDescription(0u, 2u*vertexAtrrOffset, VK_VERTEX_INPUT_RATE_VERTEX))
																.addVertexAttribute		(makeVertexInputAttributeDescription(0u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexPositionsOffset))
																.addVertexAttribute		(makeVertexInputAttributeDescription(1u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexAtrrOffset))
																.setPrimitiveTopology	(m_primitiveType)
																.build					(vk, device, *pipelineLayout, *renderPass));

	const VkDeviceSize				colorBufferSizeBytes	= resolution.x()*resolution.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer					colorBuffer				(vk, device, memAlloc, makeBufferCreateInfo(colorBufferSizeBytes,
																VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer					vertexBuffer			(vk, device, memAlloc, makeBufferCreateInfo(vertexDataSizeBytes,
																VK_BUFFER_USAGE_VERTEX_BUFFER_BIT ), MemoryRequirement::HostVisible);
	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		struct DataVec4
		{
			Vec4 pos;
			Vec4 color;
		};

		DataVec4* const pData = static_cast<DataVec4*>(alloc.getHostPtr());
		for(int ndx = 0; ndx < m_numDrawVertices; ++ndx)
		{
			pData[ndx].pos = m_vertexPosData[ndx];
			pData[ndx].color = m_vertexAttrData[ndx];
		}
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Draw commands
	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
						0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(resolution.x(), resolution.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkBuffer buffers[] = { vertexBuffer.get()};
		const VkDeviceSize offsets[] = { vertexPositionsOffset };
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, DE_LENGTH_OF_ARRAY(buffers), buffers, offsets);
	}

	bindDescriptorSets(vk, device, memAlloc, *cmdBuffer, *pipelineLayout);

	drawCommand (*cmdBuffer);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(resolution.x(), resolution.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}

	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log the result image.
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);
		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), resolution.x(), resolution.y(), 1, colorBufferAlloc.getHostPtr());

		if (!compareWithFileImage(m_context, imagePixelAccess, m_name))
			return TestStatus::fail("Fail");
	}

	return TestStatus::pass("Pass");
}